

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::optimized_impl::uint128_&,_const_trng::optimized_impl::uint128_&> *
__thiscall
Catch::ExprLhs<trng::optimized_impl::uint128_const&>::operator<=
          (BinaryExpr<const_trng::optimized_impl::uint128_&,_const_trng::optimized_impl::uint128_&>
           *__return_storage_ptr__,ExprLhs<trng::optimized_impl::uint128_const&> *this,uint128 *rhs)

{
  ulong *puVar1;
  uint128 *puVar2;
  ulong uVar3;
  ulong uVar4;
  uint128_t uVar6;
  uint128_t uVar7;
  StringRef local_38;
  ulong uVar5;
  
  puVar2 = *(uint128 **)this;
  uVar6 = rhs->value;
  uVar3 = *(ulong *)((long)&rhs->value + 8);
  uVar7 = puVar2->value;
  puVar1 = (ulong *)((long)&puVar2->value + 8);
  uVar4 = *puVar1;
  uVar5 = *puVar1;
  StringRef::StringRef(&local_38,"<=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result =
       uVar4 <= uVar3 && (ulong)((ulong)uVar6 < (ulong)uVar7) <= uVar3 - uVar5;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002eb618;
  __return_storage_ptr__->m_lhs = puVar2;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }